

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhash_kv_config(unqlite_kv_engine *pEngine,int op,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  
  if (op == 2) {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar3 + 1;
    }
    lVar4 = *plVar3;
    lVar5 = 200;
  }
  else {
    iVar2 = -0xd;
    if ((op != 1) || (iVar2 = -4, *(int *)&pEngine[0x1c].pIo != 0)) {
      return iVar2;
    }
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar3 + 1;
    }
    lVar4 = *plVar3;
    lVar5 = 0xc0;
  }
  if (lVar4 != 0) {
    *(long *)((long)&pEngine->pIo + lVar5) = lVar4;
  }
  return 0;
}

Assistant:

static int lhash_kv_config(unqlite_kv_engine *pEngine,int op,va_list ap)
{
	lhash_kv_engine *pHash = (lhash_kv_engine *)pEngine;
	int rc = UNQLITE_OK;
	switch(op){
	case UNQLITE_KV_CONFIG_HASH_FUNC: {
		/* Default hash function */
		if( pHash->nBuckRec > 0 ){
			/* Locked operation */
			rc = UNQLITE_LOCKED;
		}else{
			ProcHash xHash = va_arg(ap,ProcHash);
			if( xHash ){
				pHash->xHash = xHash;
			}
		}
		break;
									  }
	case UNQLITE_KV_CONFIG_CMP_FUNC: {
		/* Default comparison function */
		ProcCmp xCmp = va_arg(ap,ProcCmp);
		if( xCmp ){
			pHash->xCmp  = xCmp;
		}
		break;
									 }
	default:
		/* Unknown OP */
		rc = UNQLITE_UNKNOWN;
		break;
	}
	return rc;
}